

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall
FIX::double_conversion::StringBuilder::AddSubstring(StringBuilder *this,char *s,int n)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar1 = this->position_;
  if (((long)iVar1 < 0) || (iVar2 = (this->buffer_).length_, iVar2 <= iVar1 + n)) {
    __assert_fail("!is_finalized() && position_ + n < buffer_.length()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0xff,
                  "void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)");
  }
  sVar3 = strlen(s);
  if (sVar3 < (ulong)(long)n) {
    __assert_fail("static_cast<size_t>(n) <= strlen(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x100,
                  "void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)");
  }
  if (iVar1 < iVar2) {
    memmove((this->buffer_).start_ + iVar1,s,(long)n);
    this->position_ = this->position_ + n;
    return;
  }
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xca,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

void AddSubstring(const char* s, int n) {
    ASSERT(!is_finalized() && position_ + n < buffer_.length());
    ASSERT(static_cast<size_t>(n) <= strlen(s));
    memmove(&buffer_[position_], s, n * kCharSize);
    position_ += n;
  }